

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_448486::HandleAppendStringCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _List *path_00;
  bool bVar1;
  int iVar2;
  cmMakefile *pcVar3;
  const_reference arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string *local_178;
  string local_148;
  string_view local_128;
  reference local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_d8 [8];
  cmCMakePath path;
  string inputPath;
  undefined1 local_88 [8];
  OutputVariable arguments;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  if ((anonymous_namespace)::
      HandleAppendStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleAppendStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar2 != 0) {
      ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
      ArgumentParserWithOutputVariable
                (&HandleAppendStringCommand::parser.
                  super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>);
      __cxa_atexit(OutputVariableParser::~OutputVariableParser,&HandleAppendStringCommand::parser,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleAppendStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::Parse<2>
            ((OutputVariable *)local_88,
             &HandleAppendStringCommand::parser.
              super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>,args);
  pcVar3 = cmExecutionStatus::GetMakefile(status);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_88,pcVar3);
  if (bVar1) {
    args_local._7_1_ = true;
  }
  else {
    path_00 = &path.Path._M_cmpts;
    std::__cxx11::string::string((string *)path_00);
    arg = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,1);
    bVar1 = getInputPath(arg,status,(string *)path_00);
    if (bVar1) {
      std::__cxx11::string::string((string *)&__range1,(string *)&path.Path._M_cmpts);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 generic_format);
      std::__cxx11::string::~string((string *)&__range1);
      this = (anonymous_namespace)::CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
             GetInputs_abi_cxx11_
                       ((CMakePathArgumentParser<(anonymous_namespace)::OutputVariable> *)
                        &HandleAppendStringCommand::parser);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this);
      input = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&input);
        if (!bVar1) break;
        local_118 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        cmCMakePath::operator+=((cmCMakePath *)local_d8,local_118);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      pcVar3 = cmExecutionStatus::GetMakefile(status);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
      if (bVar1) {
        local_178 = &std::
                     optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*((optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                     super__Rb_tree_header._M_node_count)->
                     super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>;
      }
      else {
        local_178 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](args,1);
      }
      cmCMakePath::String_abi_cxx11_(&local_148,(cmCMakePath *)local_d8);
      local_128 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_148);
      cmMakefile::AddDefinition(pcVar3,local_178,local_128);
      std::__cxx11::string::~string((string *)&local_148);
      args_local._7_1_ = true;
      cmCMakePath::~cmCMakePath((cmCMakePath *)local_d8);
    }
    else {
      args_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)&path.Path._M_cmpts);
  }
  OutputVariable::~OutputVariable((OutputVariable *)local_88);
  return args_local._7_1_;
}

Assistant:

bool HandleAppendStringCommand(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
  static OutputVariableParser const parser{};

  const auto arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);
  for (const auto& input : parser.GetInputs()) {
    path += input;
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}